

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

size_t ZSTD_resetDStream(ZSTD_DStream *dctx)

{
  dctx->streamStage = zdss_loadHeader;
  dctx->inPos = 0;
  dctx->legacyVersion = 0;
  dctx->hostageByte = 0;
  dctx->outStart = 0;
  dctx->outEnd = 0;
  dctx->lhSize = 0;
  return 5;
}

Assistant:

size_t ZSTD_resetDStream(ZSTD_DStream* dctx)
{
    DEBUGLOG(4, "ZSTD_resetDStream");
    dctx->streamStage = zdss_loadHeader;
    dctx->lhSize = dctx->inPos = dctx->outStart = dctx->outEnd = 0;
    dctx->legacyVersion = 0;
    dctx->hostageByte = 0;
    return ZSTD_FRAMEHEADERSIZE_PREFIX;
}